

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int print_gau(char *fn)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint32 n_density;
  uint32 n_feat;
  uint32 n_mgau;
  uint32 *veclen;
  vector_t ***mean;
  
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/printp/main.c"
          ,0xa9,"Reading %s\n",fn);
  iVar1 = s3gau_read(fn,&mean,&n_mgau,&n_feat,&n_density,&veclen);
  if (iVar1 == 0) {
    printf("param %u %u %u\n",(ulong)n_mgau,(ulong)n_feat,(ulong)n_density);
    for (uVar3 = 0; uVar3 < n_mgau; uVar3 = uVar3 + 1) {
      printf("mgau %u\n",uVar3 & 0xffffffff);
      for (uVar2 = 0; uVar2 < n_feat; uVar2 = uVar2 + 1) {
        printf("feat %u\n",uVar2 & 0xffffffff);
        for (uVar4 = 0; uVar4 < n_density; uVar4 = uVar4 + 1) {
          printf("density %4u ",uVar4 & 0xffffffff);
          for (uVar5 = 0; uVar5 < veclen[uVar2]; uVar5 = uVar5 + 1) {
            printf(e_fmt,(double)mean[uVar3][uVar2][uVar4][uVar5]);
          }
          putchar(10);
        }
      }
    }
    ckd_free(veclen);
    iVar1 = 0;
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int
print_gau(const char *fn)
{
    vector_t ***mean;
    uint32 n_mgau;
    uint32 n_feat;
    uint32 *veclen;
    uint32 n_density;
    uint32 i, j, k, l;

    E_INFO("Reading %s\n",  fn);
    
    if (s3gau_read(fn,
		   &mean,
		   &n_mgau,
		   &n_feat,
		   &n_density,
		   &veclen) != S3_SUCCESS)
	return S3_ERROR;

    printf("param %u %u %u\n", n_mgau, n_feat, n_density);

    for (i = 0; i < n_mgau; i++) {
	printf("mgau %u\n", i);
	for (j = 0; j < n_feat; j++) {
	    printf("feat %u\n", j);
	    for (k = 0; k < n_density; k++) {
		printf("density %4u ", k);
		for (l = 0; l < veclen[j]; l++) {
		    printf(e_fmt, mean[i][j][k][l]);
		}
		printf("\n");
	    }
	}
    }
    ckd_free(veclen);
    return S3_SUCCESS;
}